

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void av1_inter_mode_data_fit(TileDataEnc *tile_data,int rdmult)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  long in_RDI;
  double dVar5;
  double dxy;
  double dx;
  double mx;
  double my;
  double factor;
  InterModeRdModel *md;
  int block_idx;
  int bsize;
  int local_10;
  
  for (local_10 = 0; local_10 < 0x16; local_10 = local_10 + 1) {
    iVar3 = inter_mode_data_block_idx((BLOCK_SIZE)local_10);
    piVar4 = (int *)(in_RDI + 0x5338 + (long)local_10 * 0x70);
    if (((iVar3 != -1) && ((*piVar4 != 0 || (199 < piVar4[0x10])))) &&
       ((*piVar4 != 1 || (0x3f < piVar4[0x10])))) {
      if (*piVar4 == 0) {
        *(double *)(piVar4 + 6) = *(double *)(piVar4 + 0x12) / (double)piVar4[0x10];
        *(double *)(piVar4 + 8) = *(double *)(piVar4 + 0x14) / (double)piVar4[0x10];
        *(double *)(piVar4 + 10) = *(double *)(piVar4 + 0x16) / (double)piVar4[0x10];
        *(double *)(piVar4 + 0xc) = *(double *)(piVar4 + 0x18) / (double)piVar4[0x10];
        *(double *)(piVar4 + 0xe) = *(double *)(piVar4 + 0x1a) / (double)piVar4[0x10];
      }
      else {
        *(double *)(piVar4 + 6) =
             (*(double *)(piVar4 + 6) * 3.0 + *(double *)(piVar4 + 0x12) / (double)piVar4[0x10]) /
             4.0;
        *(double *)(piVar4 + 8) =
             (*(double *)(piVar4 + 8) * 3.0 + *(double *)(piVar4 + 0x14) / (double)piVar4[0x10]) /
             4.0;
        *(double *)(piVar4 + 10) =
             (*(double *)(piVar4 + 10) * 3.0 + *(double *)(piVar4 + 0x16) / (double)piVar4[0x10]) /
             4.0;
        *(double *)(piVar4 + 0xc) =
             (*(double *)(piVar4 + 0xc) * 3.0 + *(double *)(piVar4 + 0x18) / (double)piVar4[0x10]) /
             4.0;
        *(double *)(piVar4 + 0xe) =
             (*(double *)(piVar4 + 0xe) * 3.0 + *(double *)(piVar4 + 0x1a) / (double)piVar4[0x10]) /
             4.0;
      }
      dVar1 = *(double *)(piVar4 + 8);
      dVar2 = *(double *)(piVar4 + 10);
      dVar5 = sqrt(*(double *)(piVar4 + 0xc));
      *(double *)(piVar4 + 2) =
           (-dVar2 * dVar1 + *(double *)(piVar4 + 0xe)) / (dVar5 * dVar5 + -(dVar2 * dVar2));
      *(double *)(piVar4 + 4) = -*(double *)(piVar4 + 2) * dVar2 + dVar1;
      *piVar4 = 1;
      piVar4[0x10] = 0;
      piVar4[0x12] = 0;
      piVar4[0x13] = 0;
      piVar4[0x14] = 0;
      piVar4[0x15] = 0;
      piVar4[0x16] = 0;
      piVar4[0x17] = 0;
      piVar4[0x18] = 0;
      piVar4[0x19] = 0;
      piVar4[0x1a] = 0;
      piVar4[0x1b] = 0;
    }
  }
  return;
}

Assistant:

void av1_inter_mode_data_fit(TileDataEnc *tile_data, int rdmult) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    const int block_idx = inter_mode_data_block_idx(bsize);
    InterModeRdModel *md = &tile_data->inter_mode_rd_models[bsize];
    if (block_idx == -1) continue;
    if ((md->ready == 0 && md->num < 200) || (md->ready == 1 && md->num < 64)) {
      continue;
    } else {
      if (md->ready == 0) {
        md->dist_mean = md->dist_sum / md->num;
        md->ld_mean = md->ld_sum / md->num;
        md->sse_mean = md->sse_sum / md->num;
        md->sse_sse_mean = md->sse_sse_sum / md->num;
        md->sse_ld_mean = md->sse_ld_sum / md->num;
      } else {
        const double factor = 3;
        md->dist_mean =
            (md->dist_mean * factor + (md->dist_sum / md->num)) / (factor + 1);
        md->ld_mean =
            (md->ld_mean * factor + (md->ld_sum / md->num)) / (factor + 1);
        md->sse_mean =
            (md->sse_mean * factor + (md->sse_sum / md->num)) / (factor + 1);
        md->sse_sse_mean =
            (md->sse_sse_mean * factor + (md->sse_sse_sum / md->num)) /
            (factor + 1);
        md->sse_ld_mean =
            (md->sse_ld_mean * factor + (md->sse_ld_sum / md->num)) /
            (factor + 1);
      }

      const double my = md->ld_mean;
      const double mx = md->sse_mean;
      const double dx = sqrt(md->sse_sse_mean);
      const double dxy = md->sse_ld_mean;

      md->a = (dxy - mx * my) / (dx * dx - mx * mx);
      md->b = my - md->a * mx;
      md->ready = 1;

      md->num = 0;
      md->dist_sum = 0;
      md->ld_sum = 0;
      md->sse_sum = 0;
      md->sse_sse_sum = 0;
      md->sse_ld_sum = 0;
    }
    (void)rdmult;
  }
}